

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

void __thiscall duckdb::MergeJoinLocalState::~MergeJoinLocalState(MergeJoinLocalState *this)

{
  pointer ppEVar1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__MergeJoinLocalState_0246b438;
  DataChunk::~DataChunk(&(this->table).keys);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->table).executor.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->table).executor.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  LocalSortState::~LocalSortState(&(this->table).local_sort_state);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024465d8;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

explicit MergeJoinLocalState(ClientContext &context, const PhysicalRangeJoin &op, const idx_t child)
	    : table(context, op, child) {
	}